

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::remove(filesystem *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  value_type *__filename_00;
  uint *puVar3;
  undefined7 extraout_var;
  ulong uVar4;
  error_code eVar5;
  int error;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined1 local_1;
  
  std::error_code::clear
            ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  __filename_00 = path::c_str((path *)0x290b52);
  iVar2 = ::remove(__filename_00);
  if (iVar2 == -1) {
    puVar3 = (uint *)__errno_location();
    uVar4 = (ulong)*puVar3;
    if (*puVar3 == 2) {
      local_1 = 0;
      goto LAB_00290bb0;
    }
    eVar5 = detail::make_system_error(in_stack_ffffffffffffffd4);
    *(ulong *)__filename = CONCAT44(in_stack_ffffffffffffffd4,eVar5._M_value);
    *(error_category **)(__filename + 8) = eVar5._M_cat;
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)__filename);
  uVar4 = CONCAT71(extraout_var,bVar1 + -1) & 0xffffffffffffff01;
  local_1 = (undefined1)uVar4;
LAB_00290bb0:
  return (int)CONCAT71((int7)(uVar4 >> 8),local_1);
}

Assistant:

GHC_INLINE bool remove(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
#ifdef GHC_USE_WCHAR_T
    auto cstr = p.c_str();
#else
    std::wstring np = detail::fromUtf8<std::wstring>(p.u8string());
    auto cstr = np.c_str();
#endif
    DWORD attr = GetFileAttributesW(cstr);
    if (attr == INVALID_FILE_ATTRIBUTES) {
        auto error = ::GetLastError();
        if (error == ERROR_FILE_NOT_FOUND || error == ERROR_PATH_NOT_FOUND) {
            return false;
        }
        ec = detail::make_system_error(error);
    }
    else if (attr & FILE_ATTRIBUTE_READONLY) {
        auto new_attr = attr & ~static_cast<DWORD>(FILE_ATTRIBUTE_READONLY);
        if (!SetFileAttributesW(cstr, new_attr)) {
            auto error = ::GetLastError();
            ec = detail::make_system_error(error);
        }
    }
    if (!ec) {
        if (attr & FILE_ATTRIBUTE_DIRECTORY) {
            if (!RemoveDirectoryW(cstr)) {
                ec = detail::make_system_error();
            }
        }
        else {
            if (!DeleteFileW(cstr)) {
                ec = detail::make_system_error();
            }
        }
    }
#else
    if (::remove(p.c_str()) == -1) {
        auto error = errno;
        if (error == ENOENT) {
            return false;
        }
        ec = detail::make_system_error();
    }
#endif
    return ec ? false : true;
}